

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MS3DImporter::ReadComments<Assimp::MS3DImporter::TempJoint>
          (MS3DImporter *this,StreamReaderLE *stream,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *outp)

{
  int8_t *piVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  Logger *this_00;
  runtime_error *this_01;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long *local_50 [2];
  long local_40 [2];
  
  uVar2 = StreamReader<false,_false>::Get<unsigned_short>(stream);
  if (uVar2 != 0) {
    uVar7 = (uint)uVar2;
    do {
      uVar3 = StreamReader<false,_false>::Get<unsigned_int>(stream);
      uVar4 = StreamReader<false,_false>::Get<unsigned_int>(stream);
      uVar6 = (ulong)uVar3;
      uVar5 = ((long)(outp->
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(outp->
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"MS3D: Invalid index in comment section");
      }
      else {
        piVar1 = stream->current;
        if ((uint)(*(int *)&stream->end - (int)piVar1) < uVar4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,
                     "MS3D: Failure reading comment, length field is out of range","");
          std::runtime_error::runtime_error(this_01,(string *)local_50);
          *(undefined ***)this_01 = &PTR__runtime_error_007fa260;
          __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,piVar1,piVar1 + uVar4);
        std::__cxx11::string::operator=
                  ((string *)
                   &(outp->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar6].comment,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      StreamReader<false,_false>::IncPtr(stream,(ulong)uVar4);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void MS3DImporter :: ReadComments(StreamReaderLE& stream, std::vector<T>& outp)
{
    uint16_t cnt;
    stream >> cnt;

    for(unsigned int i = 0; i < cnt; ++i) {
        uint32_t index, clength;
        stream >> index >> clength;

        if(index >= outp.size()) {
            ASSIMP_LOG_WARN("MS3D: Invalid index in comment section");
        }
        else if (clength > stream.GetRemainingSize()) {
            throw DeadlyImportError("MS3D: Failure reading comment, length field is out of range");
        }
        else {
            outp[index].comment = std::string(reinterpret_cast<char*>(stream.GetPtr()),clength);
        }
        stream.IncPtr(clength);
    }
}